

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_string_define_own_property
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter
              ,int flags)

{
  long lVar1;
  ushort uVar2;
  BOOL BVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  JSValueUnion JVar7;
  uint uVar8;
  uint uVar9;
  
  JVar7 = val.u;
  if (((int)prop < 0) && (*(int *)((long)this_obj.u.ptr + 0x38) == -7)) {
    uVar8 = prop & 0x7fffffff;
    lVar1 = *(long *)((long)this_obj.u.ptr + 0x30);
    uVar9 = (uint)*(undefined8 *)(lVar1 + 4);
    if (uVar8 < (uVar9 & 0x7fffffff)) {
      BVar3 = check_define_prop_flags(4,flags);
      if (BVar3 != 0) {
        if (((uint)flags >> 0xd & 1) == 0) {
          return 1;
        }
        if (((int)val.tag == -7) &&
           (uVar4 = (uint)*(undefined8 *)((long)JVar7.ptr + 4), (uVar4 & 0x7fffffff) == 1)) {
          if ((int)uVar9 < 0) {
            uVar6 = *(ushort *)(lVar1 + 0x10 + (ulong)uVar8 * 2);
          }
          else {
            uVar6 = (ushort)*(byte *)(lVar1 + 0x10 + (ulong)uVar8);
          }
          if ((int)uVar4 < 0) {
            uVar2 = *(ushort *)((long)JVar7.ptr + 0x10);
          }
          else {
            uVar2 = (ushort)*(byte *)((long)JVar7.ptr + 0x10);
          }
          if (uVar6 == uVar2) {
            return 1;
          }
        }
      }
      iVar5 = JS_ThrowTypeErrorOrFalse(ctx,flags,"property is not configurable");
      return iVar5;
    }
  }
  iVar5 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,flags | 0x20000);
  return iVar5;
}

Assistant:

static int js_string_define_own_property(JSContext *ctx,
                                         JSValueConst this_obj,
                                         JSAtom prop, JSValueConst val,
                                         JSValueConst getter,
                                         JSValueConst setter, int flags)
{
    uint32_t idx;
    JSObject *p;
    JSString *p1, *p2;
    
    if (__JS_AtomIsTaggedInt(prop)) {
        idx = __JS_AtomToUInt32(prop);
        p = JS_VALUE_GET_OBJ(this_obj);
        if (JS_VALUE_GET_TAG(p->u.object_data) != JS_TAG_STRING)
            goto def;
        p1 = JS_VALUE_GET_STRING(p->u.object_data);
        if (idx >= p1->len)
            goto def;
        if (!check_define_prop_flags(JS_PROP_ENUMERABLE, flags))
            goto fail;
        /* check that the same value is configured */
        if (flags & JS_PROP_HAS_VALUE) {
            if (JS_VALUE_GET_TAG(val) != JS_TAG_STRING)
                goto fail;
            p2 = JS_VALUE_GET_STRING(val);
            if (p2->len != 1)
                goto fail;
            if (string_get(p1, idx) != string_get(p2, 0)) {
            fail:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
            }
        }
        return TRUE;
    } else {
    def:
        return JS_DefineProperty(ctx, this_obj, prop, val, getter, setter,
                                 flags | JS_PROP_NO_EXOTIC);
    }
}